

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromosome.h
# Opt level: O3

void __thiscall tsp::Chromosome::Chromosome(Chromosome *this,Region *region)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  iterator __position;
  undefined8 in_RAX;
  uint uVar3;
  undefined8 uStack_38;
  
  p_Var1 = &(this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->region).mapOfCities._M_t._M_impl = 0;
  *(undefined8 *)&(this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar2 = (uint)(region->mapOfCities)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  uStack_38 = in_RAX;
  if (uVar2 != 0) {
    uVar3 = 1;
    do {
      uStack_38 = CONCAT44(uVar3,(undefined4)uStack_38);
      __position._M_current =
           (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->values,__position,(int *)((long)&uStack_38 + 4));
      }
      else {
        *__position._M_current = uVar3;
        (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = __position._M_current + 1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 <= uVar2);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_tsp::City>,_std::_Select1st<std::pair<const_int,_tsp::City>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tsp::City>_>_>
  ::operator=((_Rb_tree<int,_std::pair<const_int,_tsp::City>,_std::_Select1st<std::pair<const_int,_tsp::City>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tsp::City>_>_>
               *)this,(_Rb_tree<int,_std::pair<const_int,_tsp::City>,_std::_Select1st<std::pair<const_int,_tsp::City>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tsp::City>_>_>
                       *)region);
  return;
}

Assistant:

Chromosome::Chromosome(tsp::Region &region) {
        this->values = std::vector<int>();
        uint size = region.countCities();

        for (uint v = 1; v <= size; v++) {
            this->values.push_back(v);
        }

        this->region = region;
    }